

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# henson-chai.cpp
# Opt level: O0

void catch_sig(int signum)

{
  format_string_t<char_*&> fmt;
  format_string_t<char_*&,_char_*&,_char_*&> fmt_00;
  format_string_t<char_*&,_char_*&,_char_*&> fmt_01;
  format_string_t<int_&,_std::__cxx11::basic_string<char>_&,_std::__cxx11::basic_string<char>,_int>
  fmt_02;
  element_type *this;
  char *pcVar1;
  size_t sVar2;
  pointer pLVar3;
  int in_EDI;
  char *ret;
  int status;
  char *p;
  char *end_offset;
  char *begin_offset;
  char *begin_name;
  int i;
  char *funcname;
  size_t funcnamesize;
  char **strs;
  int frames;
  void *callstack [128];
  ProcMap *in_stack_fffffffffffffa30;
  ProcMap *in_stack_fffffffffffffa38;
  element_type *in_stack_fffffffffffffa40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa48;
  element_type *in_stack_fffffffffffffa50;
  char **in_stack_fffffffffffffa58;
  char **ppcVar4;
  shared_ptr<henson::ProcMap> *psVar5;
  pointer in_stack_fffffffffffffa80;
  char *local_570 [2];
  char *local_560 [2];
  void *local_550;
  int local_544;
  char *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  int local_51c;
  void *local_518;
  undefined8 local_510;
  void *local_508;
  int local_4fc;
  undefined1 local_4f8 [1052];
  int local_dc;
  string local_d8 [32];
  char *local_b8 [2];
  int local_a4;
  char *local_a0;
  char **local_98;
  char *local_90;
  char **local_88;
  char *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *local_70;
  ProcMap *local_68;
  char *local_60;
  ProcMap *local_58;
  char *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *local_40;
  char **local_38;
  char *local_30;
  char **local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_a4 = in_EDI;
  this = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )0x157eaa);
  ppcVar4 = local_b8;
  local_a0 = "caught signal {}; active puppet {}; local group = {}, local rank = {}";
  local_30 = "caught signal {}; active puppet {}; local group = {}, local rank = {}";
  local_b8[0] = "caught signal {}; active puppet {}; local group = {}, local rank = {}";
  local_98 = ppcVar4;
  local_28 = ppcVar4;
  pcVar1 = (char *)std::char_traits<char>::length((char_type *)0x157f13);
  ppcVar4[1] = pcVar1;
  local_20 = local_a0;
  psVar5 = &proc_map;
  std::__shared_ptr_access<henson::ProcMap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<henson::ProcMap,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x157f40);
  henson::ProcMap::group_abi_cxx11_(in_stack_fffffffffffffa38);
  std::__shared_ptr_access<henson::ProcMap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<henson::ProcMap,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x157f5a);
  local_dc = henson::ProcMap::local_rank(in_stack_fffffffffffffa30);
  fmt_02.str_.size_ = (size_t)psVar5;
  fmt_02.str_.data_ = (char *)ppcVar4;
  spdlog::logger::critical<int&,std::__cxx11::string&,std::__cxx11::string,int>
            (this,fmt_02,(int *)in_stack_fffffffffffffa58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,(int *)in_stack_fffffffffffffa80);
  std::__cxx11::string::~string(local_d8);
  local_4fc = backtrace(local_4f8,0x80);
  local_508 = (void *)backtrace_symbols(local_4f8,local_4fc);
  local_510 = 0x100;
  local_518 = malloc(0x100);
  local_51c = 1;
  do {
    if (local_4fc <= local_51c) {
      free(local_518);
      free(local_508);
      signal(local_a4,(__sighandler_t)0x0);
      if ((abort_on_segfault_ & 1U) != 0) {
        MPI_Abort(&ompi_mpi_comm_world,1);
      }
      return;
    }
    local_528 = (char *)0x0;
    local_530 = (char *)0x0;
    local_538 = (char *)0x0;
    for (local_540 = *(char **)((long)local_508 + (long)local_51c * 8); *local_540 != '\0';
        local_540 = local_540 + 1) {
      if (*local_540 == '(') {
        local_528 = local_540;
      }
      else if (*local_540 == '+') {
        local_530 = local_540;
      }
      else if ((*local_540 == ')') && (local_530 != (char *)0x0)) {
        local_538 = local_540;
        break;
      }
    }
    if ((((local_528 == (char *)0x0) || (local_530 == (char *)0x0)) || (local_538 == (char *)0x0))
       || (local_530 <= local_528)) {
      std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1583b5);
      in_stack_fffffffffffffa38 = (ProcMap *)&stack0xfffffffffffffa80;
      local_70 = "  {}";
      local_60 = "  {}";
      local_68 = in_stack_fffffffffffffa38;
      local_58 = in_stack_fffffffffffffa38;
      pLVar3 = (pointer)std::char_traits<char>::length((char_type *)0x15841b);
      (in_stack_fffffffffffffa38->levels_).
      super__Vector_base<henson::ProcMap::Level,_std::allocator<henson::ProcMap::Level>_>._M_impl.
      super__Vector_impl_data._M_finish = pLVar3;
      local_8 = local_70;
      fmt.str_.size_ = (size_t)in_stack_fffffffffffffa50;
      fmt.str_.data_ = (char *)in_stack_fffffffffffffa48;
      spdlog::logger::critical<char*&>
                (in_stack_fffffffffffffa40,fmt,(char **)in_stack_fffffffffffffa38);
    }
    else {
      pcVar1 = local_528 + 1;
      *local_528 = '\0';
      *local_530 = '\0';
      *local_538 = '\0';
      local_530 = local_530 + 1;
      local_528 = pcVar1;
      local_550 = (void *)__cxa_demangle(pcVar1,local_518,&local_510,&local_544);
      if (local_544 == 0) {
        local_518 = local_550;
        in_stack_fffffffffffffa50 =
             std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x158216);
        in_stack_fffffffffffffa58 = local_560;
        local_90 = "  {} : {}+{}";
        local_40 = "  {} : {}+{}";
        local_560[0] = "  {} : {}+{}";
        local_88 = in_stack_fffffffffffffa58;
        local_38 = in_stack_fffffffffffffa58;
        pcVar1 = (char *)std::char_traits<char>::length((char_type *)0x15827c);
        in_stack_fffffffffffffa58[1] = pcVar1;
        local_18 = local_90;
        fmt_00.str_.size_ = (size_t)this;
        fmt_00.str_.data_ = (char *)in_stack_fffffffffffffa58;
        spdlog::logger::critical<char*&,char*&,char*&>
                  (in_stack_fffffffffffffa50,fmt_00,(char **)in_stack_fffffffffffffa48,
                   (char **)in_stack_fffffffffffffa40,(char **)in_stack_fffffffffffffa38);
      }
      else {
        in_stack_fffffffffffffa40 =
             std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1582e7);
        in_stack_fffffffffffffa48 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_570;
        local_80 = "  {} : {}()+{}";
        local_50 = "  {} : {}()+{}";
        local_570[0] = "  {} : {}()+{}";
        local_78 = in_stack_fffffffffffffa48;
        local_48 = in_stack_fffffffffffffa48;
        sVar2 = std::char_traits<char>::length((char_type *)0x15834d);
        in_stack_fffffffffffffa48->_M_string_length = sVar2;
        local_10 = local_80;
        fmt_01.str_.size_ = (size_t)this;
        fmt_01.str_.data_ = (char *)in_stack_fffffffffffffa58;
        spdlog::logger::critical<char*&,char*&,char*&>
                  (in_stack_fffffffffffffa50,fmt_01,(char **)in_stack_fffffffffffffa48,
                   (char **)in_stack_fffffffffffffa40,(char **)in_stack_fffffffffffffa38);
      }
    }
    local_51c = local_51c + 1;
  } while( true );
}

Assistant:

void catch_sig(int signum)
{
    logger->critical("caught signal {}; active puppet {}; local group = {}, local rank = {}",
                     signum, active_puppet, proc_map->group(), proc_map->local_rank());

    // print backtrace
    void*   callstack[128];
    int     frames      = backtrace(callstack, 128);
    char**  strs        = backtrace_symbols(callstack, frames);

    size_t funcnamesize = 256;
    char*  funcname     = (char*) malloc(funcnamesize);

    // iterate over the returned symbol lines. skip the first, it is the
    // address of this function.
    for (int i = 1; i < frames; i++)
    {
        char *begin_name = 0, *begin_offset = 0, *end_offset = 0;

        // find parentheses and +address offset surrounding the mangled name:
        // ./module(function+0x15c) [0x8048a6d]
        for (char *p = strs[i]; *p; ++p)
        {
            if (*p == '(')
                begin_name = p;
            else if (*p == '+')
                begin_offset = p;
            else if (*p == ')' && begin_offset)
            {
                end_offset = p;
                break;
            }
        }

        if (begin_name && begin_offset && end_offset && begin_name < begin_offset)
        {
            *begin_name++   = '\0';
            *begin_offset++ = '\0';
            *end_offset     = '\0';

            // mangled name is now in [begin_name, begin_offset) and caller
            // offset in [begin_offset, end_offset). now apply __cxa_demangle():

            int status;
            char* ret = abi::__cxa_demangle(begin_name, funcname, &funcnamesize, &status);
            if (status == 0)
            {
                funcname = ret; // use possibly realloc()-ed string
                logger->critical("  {} : {}+{}", strs[i], funcname, begin_offset);
            } else
            {
                // demangling failed. Output function name as a C function with no arguments.
                logger->critical("  {} : {}()+{}", strs[i], begin_name, begin_offset);
            }
        }
        else
        {
            // couldn't parse the line? print the whole line.
            logger->critical("  {}", strs[i]);
        }
    }

    free(funcname);
    free(strs);

    //for (int i = 0; i < frames; ++i)
    //    logger->critical("{}", strs[i]);

    signal(signum, SIG_DFL);    // restore the default signal
    if (abort_on_segfault_)
        MPI_Abort(MPI_COMM_WORLD, 1);
}